

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testNativeFormat.cpp
# Opt level: O0

void anon_unknown.dwarf_1cf8c0::readBackImage
               (char *fileName,Array2D<Imf_3_4::Rgba> *pixels,Array2D<Imf_3_4::Rgba> *pixels2,int *w
               ,int *h,int *xs,int *ys)

{
  uint16_t uVar1;
  uint16_t uVar2;
  int iVar3;
  long sizeY;
  ostream *poVar4;
  Rgba *pRVar5;
  void *this;
  int *in_RCX;
  Array2D<Imf_3_4::Rgba> *in_RDX;
  Array2D<Imf_3_4::Rgba> *in_RSI;
  char *in_RDI;
  int *in_R8;
  _Base_ptr in_R9;
  int *in_stack_00000008;
  int x;
  int y;
  int yStride;
  int xStride;
  Rgba *base;
  FrameBuffer frameBuffer;
  Box2i dw;
  InputFile file;
  undefined4 in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe0c;
  undefined4 in_stack_fffffffffffffe10;
  undefined4 uVar6;
  undefined4 in_stack_fffffffffffffe14;
  undefined4 in_stack_fffffffffffffe68;
  int iVar7;
  undefined4 in_stack_fffffffffffffe6c;
  Array2D<Imf_3_4::Rgba> *in_stack_fffffffffffffe70;
  Slice local_158 [56];
  Slice local_120 [56];
  Slice local_e8 [56];
  int local_b0;
  int local_ac;
  Rgba *local_a8;
  char local_a0 [64];
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  FrameBuffer local_50;
  int *local_20;
  Array2D<Imf_3_4::Rgba> *local_18;
  Array2D<Imf_3_4::Rgba> *local_10;
  
  local_50._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right = in_R9;
  local_50._map._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  iVar3 = Imf_3_4::globalThreadCount();
  Imf_3_4::InputFile::InputFile((InputFile *)&local_50,in_RDI,iVar3);
  sizeY = Imf_3_4::InputFile::header();
  Imf_3_4::Header::dataWindow();
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::Box
            ((Box<Imath_3_2::Vec2<int>_> *)
             CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
             (Box<Imath_3_2::Vec2<int>_> *)
             CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
  *local_20 = (local_58 - local_60) + 1;
  *(int *)local_50._map._M_t._M_impl.super__Rb_tree_header._M_node_count = (local_54 - local_5c) + 1
  ;
  Imf_3_4::Array2D<Imf_3_4::Rgba>::resizeErase
            (in_stack_fffffffffffffe70,CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)
             ,sizeY);
  Imf_3_4::FrameBuffer::FrameBuffer((FrameBuffer *)0x1e0418);
  local_a8 = Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](local_10,0);
  local_a8 = local_a8 + (-(long)local_60 - (long)(local_5c * *local_20));
  local_ac = (local_50._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right)->_M_color << 3;
  local_b0 = *local_20 * *in_stack_00000008 * 8;
  Imf_3_4::Slice::Slice
            (local_e8,HALF,(char *)local_a8,(long)local_ac,(long)local_b0,
             (local_50._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right)->_M_color,
             *in_stack_00000008,0.0,false,false);
  Imf_3_4::FrameBuffer::insert(local_a0,(Slice *)0x225753);
  Imf_3_4::Slice::Slice
            (local_120,HALF,(char *)&local_a8->g,(long)local_ac,(long)local_b0,
             (local_50._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right)->_M_color,
             *in_stack_00000008,0.0,false,false);
  Imf_3_4::FrameBuffer::insert(local_a0,(Slice *)0x225766);
  Imf_3_4::Slice::Slice
            (local_158,HALF,(char *)&local_a8->b,(long)local_ac,(long)local_b0,
             (local_50._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right)->_M_color,
             *in_stack_00000008,0.0,false,false);
  Imf_3_4::FrameBuffer::insert(local_a0,(Slice *)0x225779);
  uVar6 = 0;
  Imf_3_4::Slice::Slice
            ((Slice *)&stack0xfffffffffffffe70,HALF,(char *)&local_a8->a,(long)local_ac,
             (long)local_b0,
             (local_50._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right)->_M_color,
             *in_stack_00000008,1.0,false,false);
  Imf_3_4::FrameBuffer::insert(local_a0,(Slice *)0x22ec89);
  Imf_3_4::InputFile::setFrameBuffer(&local_50);
  Imf_3_4::InputFile::readPixels((int)&local_50,local_5c);
  poVar4 = std::operator<<((ostream *)&std::cout,"comparing, ");
  std::ostream::operator<<(poVar4,std::flush<char,std::char_traits<char>>);
  iVar3 = 0;
  do {
    if (*(int *)local_50._map._M_t._M_impl.super__Rb_tree_header._M_node_count <= iVar3) {
      poVar4 = std::operator<<((ostream *)&std::cout,"ok");
      this = (void *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::ostream::operator<<(this,std::flush<char,std::char_traits<char>>);
      Imf_3_4::FrameBuffer::~FrameBuffer((FrameBuffer *)0x1e09ee);
      Imf_3_4::InputFile::~InputFile((InputFile *)CONCAT44(in_stack_fffffffffffffe14,uVar6));
      return;
    }
    for (iVar7 = 0; iVar7 < *local_20;
        iVar7 = (local_50._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right)->_M_color +
                iVar7) {
      pRVar5 = Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](local_18,(long)iVar3);
      uVar1 = Imath_3_2::half::bits(&pRVar5[iVar7].r);
      pRVar5 = Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](local_10,(long)iVar3);
      uVar2 = Imath_3_2::half::bits(&pRVar5[iVar7].r);
      if (uVar1 != uVar2) {
        __assert_fail("pixels2[y][x].r.bits () == pixels[y][x].r.bits ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testNativeFormat.cpp"
                      ,0x90,
                      "void (anonymous namespace)::readBackImage(const char *, Array2D<Rgba> &, const Array2D<Rgba> &, int &, int &, const int &, const int &)"
                     );
      }
      pRVar5 = Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](local_18,(long)iVar3);
      uVar1 = Imath_3_2::half::bits(&pRVar5[iVar7].g);
      pRVar5 = Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](local_10,(long)iVar3);
      uVar2 = Imath_3_2::half::bits(&pRVar5[iVar7].g);
      if (uVar1 != uVar2) {
        __assert_fail("pixels2[y][x].g.bits () == pixels[y][x].g.bits ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testNativeFormat.cpp"
                      ,0x91,
                      "void (anonymous namespace)::readBackImage(const char *, Array2D<Rgba> &, const Array2D<Rgba> &, int &, int &, const int &, const int &)"
                     );
      }
      pRVar5 = Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](local_18,(long)iVar3);
      uVar1 = Imath_3_2::half::bits(&pRVar5[iVar7].b);
      pRVar5 = Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](local_10,(long)iVar3);
      uVar2 = Imath_3_2::half::bits(&pRVar5[iVar7].b);
      if (uVar1 != uVar2) {
        __assert_fail("pixels2[y][x].b.bits () == pixels[y][x].b.bits ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testNativeFormat.cpp"
                      ,0x92,
                      "void (anonymous namespace)::readBackImage(const char *, Array2D<Rgba> &, const Array2D<Rgba> &, int &, int &, const int &, const int &)"
                     );
      }
      pRVar5 = Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](local_18,(long)iVar3);
      uVar1 = Imath_3_2::half::bits(&pRVar5[iVar7].a);
      pRVar5 = Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](local_10,(long)iVar3);
      uVar2 = Imath_3_2::half::bits(&pRVar5[iVar7].a);
      if (uVar1 != uVar2) {
        __assert_fail("pixels2[y][x].a.bits () == pixels[y][x].a.bits ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testNativeFormat.cpp"
                      ,0x93,
                      "void (anonymous namespace)::readBackImage(const char *, Array2D<Rgba> &, const Array2D<Rgba> &, int &, int &, const int &, const int &)"
                     );
      }
    }
    iVar3 = *in_stack_00000008 + iVar3;
  } while( true );
}

Assistant:

void
readBackImage (
    const char           fileName[],
    Array2D<Rgba>&       pixels,
    const Array2D<Rgba>& pixels2,
    int&                 w,
    int&                 h,
    const int&           xs,
    const int&           ys)
{
    InputFile file (fileName);

    Box2i dw = file.header ().dataWindow ();
    w        = dw.max.x - dw.min.x + 1;
    h        = dw.max.y - dw.min.y + 1;

    pixels.resizeErase (h, w);

    FrameBuffer frameBuffer;

    Rgba* base    = &pixels[0][0] - dw.min.x - dw.min.y * w;
    int   xStride = sizeof (pixels[0][0]) * xs;
    int   yStride = sizeof (pixels[0][0]) * w * ys;

    frameBuffer.insert (
        "R", // name
        Slice (
            HALF,               // type
            (char*) &base[0].r, // base
            xStride,            // xStride
            yStride,            // yStride
            xs,
            ys,    // x/y sampling
            0.0)); // fillValue

    frameBuffer.insert (
        "G", // name
        Slice (
            HALF,               // type
            (char*) &base[0].g, // base
            xStride,            // xStride
            yStride,            // yStride
            xs,
            ys,    // x/y sampling
            0.0)); // fillValue

    frameBuffer.insert (
        "B", // name
        Slice (
            HALF,               // type
            (char*) &base[0].b, // base
            xStride,            // xStride
            yStride,            // yStride
            xs,
            ys,    // x/y sampling
            0.0)); // fillValue

    frameBuffer.insert (
        "A", // name
        Slice (
            HALF,               // type
            (char*) &base[0].a, // base
            xStride,            // xStride
            yStride,            // yStride
            xs,
            ys,    // x/y sampling
            1.0)); // fillValue

    file.setFrameBuffer (frameBuffer);
    file.readPixels (dw.min.y, dw.max.y);

    cout << "comparing, " << flush;
    for (int y = 0; y < h; y += ys)
        for (int x = 0; x < w; x += xs)
        {
            assert (pixels2[y][x].r.bits () == pixels[y][x].r.bits ());
            assert (pixels2[y][x].g.bits () == pixels[y][x].g.bits ());
            assert (pixels2[y][x].b.bits () == pixels[y][x].b.bits ());
            assert (pixels2[y][x].a.bits () == pixels[y][x].a.bits ());
        }
    cout << "ok" << endl << flush;
}